

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall ONX_ModelTest::Dump(ONX_ModelTest *this,ON_TextLog *text_log)

{
  ONX_ErrorCounter *pOVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ONX_ErrorCounter error_counter;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  uint uVar9;
  char *pcVar10;
  wchar_t *pwVar11;
  ulong uVar12;
  bool local_17c;
  Type local_17a;
  bool local_179;
  uint i_1;
  uint local_8c;
  uint i;
  bool local_61;
  bool bSkipDetails;
  uint imax;
  bool bSkipCompare;
  undefined1 local_28 [8];
  ON_wString test_log_source_archive;
  Type test_type;
  ON_TextLog *text_log_local;
  ONX_ModelTest *this_local;
  
  test_log_source_archive.m_s._7_1_ = TestType(this);
  pcVar10 = TestTypeToString(test_log_source_archive.m_s._7_1_);
  ON_TextLog::Print(text_log,"Test type: %s\n",pcVar10);
  TextLogSource3dmFilePath((ONX_ModelTest *)local_28);
  pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_28);
  ON_TextLog::Print(text_log,L"Source 3dm file path: %ls\n",pwVar11);
  uVar9 = Source3dmFileVersion(this);
  ON_TextLog::Print(text_log,L"Source 3dm file version: %u\n",(ulong)uVar9);
  ON_TextLog::Print(text_log,"Result: ");
  InternalDumpResultAndErrorCount(this->m_test_result,this->m_error_count,text_log);
  uVar9 = Source3dmFileVersion(this);
  bVar8 = SkipCompare(uVar9);
  local_179 = bVar8 && test_log_source_archive.m_s._7_1_ == ReadWriteReadCompare;
  if (bVar8 && test_log_source_archive.m_s._7_1_ == ReadWriteReadCompare) {
    local_17a = ReadWriteRead;
  }
  else {
    local_17a = test_log_source_archive.m_s._7_1_;
  }
  uVar9 = (uint)local_17a;
  local_61 = InternalCleanPass(this->m_test_result,this->m_error_count);
  local_8c = 0;
  while( true ) {
    local_17c = false;
    if (local_8c <= uVar9) {
      local_17c = local_61;
    }
    if (local_17c == false) break;
    uVar12 = (ulong)local_8c;
    uVar2 = this->m_error_counts[uVar12].m_opennurbs_library_error_count;
    uVar3 = this->m_error_counts[uVar12].m_opennurbs_library_warning_count;
    error_counter.m_opennurbs_library_warning_count = uVar3;
    error_counter.m_opennurbs_library_error_count = uVar2;
    pOVar1 = this->m_error_counts + uVar12;
    uVar4 = pOVar1->m_failure_count;
    uVar5 = pOVar1->m_error_count;
    uVar6 = pOVar1->m_warning_count;
    uVar7 = pOVar1->m_state_bit_field;
    error_counter.m_state_bit_field = uVar7;
    error_counter.m_warning_count = uVar6;
    error_counter.m_error_count = uVar5;
    error_counter.m_failure_count = uVar4;
    local_61 = InternalCleanPass(this->m_test_results[uVar12],error_counter);
    local_8c = local_8c + 1;
  }
  if (local_61 == false) {
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"Initialization: ");
    InternalDumpResultAndErrorCount(this->m_test_results[0],this->m_error_counts[0],text_log);
    if (uVar9 != 0) {
      ON_TextLog::Print(text_log,"Read source file: ");
      InternalDumpResultAndErrorCount(this->m_test_results[1],this->m_error_counts[1],text_log);
      if (1 < uVar9) {
        ON_TextLog::Print(text_log,"Write temporary files: ");
        InternalDumpResultAndErrorCount(this->m_test_results[2],this->m_error_counts[2],text_log);
        if (2 < uVar9) {
          ON_TextLog::Print(text_log,"Read temporary files: ");
          InternalDumpResultAndErrorCount(this->m_test_results[3],this->m_error_counts[3],text_log);
          if (3 < uVar9) {
            ON_TextLog::Print(text_log,"Compare models from source and temporary file: ");
            InternalDumpResultAndErrorCount
                      (this->m_test_results[4],this->m_error_counts[4],text_log);
          }
        }
      }
    }
    ON_TextLog::PopIndent(text_log);
  }
  else if (local_179) {
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"Compare test skipped because source file version is too old.\n");
    ON_TextLog::PopIndent(text_log);
  }
  ON_wString::~ON_wString((ON_wString *)local_28);
  return;
}

Assistant:

void ONX_ModelTest::Dump(ON_TextLog& text_log) const
{
  const ONX_ModelTest::Type test_type = TestType();

  text_log.Print("Test type: %s\n", ONX_ModelTest::TestTypeToString(test_type));

  //const ON_wString source_archive = Source3dmFilePath();
  const ON_wString test_log_source_archive = TextLogSource3dmFilePath();
  text_log.Print(L"Source 3dm file path: %ls\n", static_cast<const wchar_t*>(test_log_source_archive));
  text_log.Print(L"Source 3dm file version: %u\n", Source3dmFileVersion());

  text_log.Print("Result: ");
  InternalDumpResultAndErrorCount(m_test_result, m_error_count, text_log);

  //const int i_rwrcompare = static_cast<const unsigned char>(ONX_ModelTest::Type::ReadWriteReadCompare);
  const bool bSkipCompare
    = ONX_ModelTest::SkipCompare(Source3dmFileVersion())
    && ONX_ModelTest::Type::ReadWriteReadCompare == test_type;
  const unsigned int imax
    = bSkipCompare
    ? static_cast<const unsigned char>(ONX_ModelTest::Type::ReadWriteRead)
    : static_cast<const unsigned char>(test_type);
  bool bSkipDetails = InternalCleanPass(m_test_result, m_error_count);
  for (unsigned int i = 0; i <= imax && bSkipDetails; i++)
  {
    bSkipDetails = InternalCleanPass(m_test_results[i], m_error_counts[i]);
  }  

  if (bSkipDetails)
  {
    if (bSkipCompare)
    {
      text_log.PushIndent();
      text_log.Print("Compare test skipped because source file version is too old.\n");
      text_log.PopIndent();
    }
    return;
  }

  text_log.PushIndent();
  for(;;)
  {
    unsigned int i = 0;
    text_log.Print("Initialization: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Read source file: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Write temporary files: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Read temporary files: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Compare models from source and temporary file: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    break;
  }
  text_log.PopIndent();  
}